

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

void __thiscall Palette::writeSettings(Palette *this,QSettings *settings)

{
  long lVar1;
  undefined1 *puVar2;
  QString color;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QString local_48;
  
  QSettings::beginGroup((QString *)settings);
  local_68.shared = (PrivateShared *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  QSettings::remove((QString *)settings);
  if ((QArrayData *)local_68.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_68.shared = *(int *)local_68.shared + -1;
    UNLOCK();
    if (*(int *)local_68.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_68.shared,2,8);
    }
  }
  puVar2 = PaletteTU::ColorKeys;
  lVar1 = 0;
  do {
    QColor::name((NameFormat)&local_48);
    QVariant::QVariant((QVariant *)&local_68,&local_48);
    QSettings::setValue((QString *)settings,(QVariant *)puVar2);
    QVariant::~QVariant((QVariant *)&local_68);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    lVar1 = lVar1 + 0x10;
    puVar2 = &(((QVariant *)puVar2)->d).field_0x18;
  } while (lVar1 != 0x1a0);
  QSettings::endGroup();
  return;
}

Assistant:

void Palette::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Palette);
    settings.remove(QString()); // remove everything

    for (int i = 0; i < ColorCount; ++i) {
        QString color = mData[i].name();
        settings.setValue(TU::ColorKeys[i], color);
    }

    settings.endGroup();

}